

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O0

DiyFp __thiscall rapidjson::internal::DiyFp::operator*(DiyFp *this,DiyFp *rhs)

{
  ulong uVar1;
  ulong uVar2;
  uint *in_RSI;
  uint *in_RDI;
  DiyFp DVar3;
  uint64_t tmp;
  uint64_t bd;
  uint64_t ad;
  uint64_t bc;
  uint64_t ac;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t M32;
  undefined1 local_10 [12];
  
  uVar1 = (ulong)*in_RDI * (ulong)in_RSI[1];
  uVar2 = (ulong)in_RDI[1] * (ulong)*in_RSI;
  DiyFp((DiyFp *)local_10,
        (ulong)in_RDI[1] * (ulong)in_RSI[1] + (uVar2 >> 0x20) + (uVar1 >> 0x20) +
        (((ulong)*in_RDI * (ulong)*in_RSI >> 0x20) + (uVar2 & 0xffffffff) + (uVar1 & 0xffffffff) +
         0x80000000 >> 0x20),in_RDI[2] + 0x40 + in_RSI[2]);
  DVar3._12_4_ = 0;
  DVar3.f = local_10._0_8_;
  DVar3.e = local_10._8_4_;
  return DVar3;
}

Assistant:

DiyFp operator*(const DiyFp& rhs) const {
#if defined(_MSC_VER) && defined(_M_AMD64)
        uint64_t h;
        uint64_t l = _umul128(f, rhs.f, &h);
        if (l & (uint64_t(1) << 63)) // rounding
            h++;
        return DiyFp(h, e + rhs.e + 64);
#elif defined(__GNUC__) && (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 6)) && defined(__x86_64__)
        __extension__ typedef unsigned __int128 uint128;
        uint128 p = static_cast<uint128>(f) * static_cast<uint128>(rhs.f);
        uint64_t h = static_cast<uint64_t>(p >> 64);
        uint64_t l = static_cast<uint64_t>(p);
        if (l & (uint64_t(1) << 63)) // rounding
            h++;
        return DiyFp(h, e + rhs.e + 64);
#else
        const uint64_t M32 = 0xFFFFFFFF;
        const uint64_t a = f >> 32;
        const uint64_t b = f & M32;
        const uint64_t c = rhs.f >> 32;
        const uint64_t d = rhs.f & M32;
        const uint64_t ac = a * c;
        const uint64_t bc = b * c;
        const uint64_t ad = a * d;
        const uint64_t bd = b * d;
        uint64_t tmp = (bd >> 32) + (ad & M32) + (bc & M32);
        tmp += 1U << 31;  /// mult_round
        return DiyFp(ac + (ad >> 32) + (bc >> 32) + (tmp >> 32), e + rhs.e + 64);
#endif
    }